

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

uint8_t * JS_GetArrayBuffer(JSContext *ctx,size_t *psize,JSValue obj)

{
  JSArrayBuffer *pJVar1;
  
  pJVar1 = js_get_array_buffer(ctx,obj);
  if (pJVar1 != (JSArrayBuffer *)0x0) {
    if (pJVar1->detached == '\0') {
      *psize = (long)pJVar1->byte_length;
      return pJVar1->data;
    }
    JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
  }
  *psize = 0;
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *JS_GetArrayBuffer(JSContext *ctx, size_t *psize, JSValueConst obj)
{
    JSArrayBuffer *abuf = js_get_array_buffer(ctx, obj);
    if (!abuf)
        goto fail;
    if (abuf->detached) {
        JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        goto fail;
    }
    *psize = abuf->byte_length;
    return abuf->data;
 fail:
    *psize = 0;
    return NULL;
}